

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O2

void __thiscall
fp::Algorithm::FindNeighbours(Algorithm *this,array<int,_2UL> cur_node,char curr_dir)

{
  bool bVar1;
  bool bVar2;
  array<int,_2UL> cur_node_00;
  array<int,_2UL> cur_node_01;
  array<int,_2UL> cur_node_02;
  array<int,_2UL> cur_node_03;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  array<int,_2UL> node_E;
  array<int,_2UL> node_S;
  array<int,_2UL> node_W;
  array<int,_2UL> node_N;
  value_type local_50;
  value_type local_48;
  value_type local_40;
  value_type local_38;
  
  (**((this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_LandBasedRobot)();
  iVar8 = cur_node._M_elems[0];
  lVar7 = (long)cur_node._M_elems >> 0x20;
  bVar5 = (this->maze_info).North_._M_elems[iVar8]._M_elems[lVar7];
  bVar1 = (this->maze_info).South_._M_elems[iVar8]._M_elems[lVar7];
  bVar4 = (this->maze_info).East_._M_elems[iVar8]._M_elems[lVar7];
  bVar2 = (this->maze_info).West_._M_elems[iVar8]._M_elems[lVar7];
  local_38._M_elems[0] = iVar8 + -1;
  iVar6 = cur_node._M_elems[1];
  local_40._M_elems[1] = iVar6 + -1;
  local_48._M_elems[0] = iVar8 + 1;
  local_50._M_elems[1] = iVar6 + 1;
  local_50._M_elems[0] = iVar8;
  local_48._M_elems[1] = iVar6;
  local_40._M_elems[0] = iVar8;
  local_38._M_elems[1] = iVar6;
  bVar3 = IsVisited(this,cur_node);
  if (!bVar3) {
    (this->visited_node_)._M_elems[iVar8]._M_elems[lVar7] = true;
    this->visited_Count = this->visited_Count + 1;
    if ((((this->temp_goal_ == false) && (iVar6 < 0xf)) && (curr_dir != 'W')) && (bVar4 == false)) {
      std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::push_back
                (&(this->node_master_)._M_elems[iVar8]._M_elems[lVar7].child_node_.c,&local_50);
      cur_node_00._M_elems[1] = local_50._M_elems[1];
      cur_node_00._M_elems[0] = local_50._M_elems[0];
      bVar4 = IsVisited(this,cur_node_00);
      if (!bVar4) {
        *&(this->node_master_)._M_elems[local_50._M_elems[0]]._M_elems[local_50._M_elems[1]].
          parent_node_._M_elems = cur_node._M_elems;
      }
    }
    if (((this->temp_goal_ == false) && (0 < iVar8)) && ((curr_dir != 'S' && (bVar5 == false)))) {
      std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::push_back
                (&(this->node_master_)._M_elems[iVar8]._M_elems[lVar7].child_node_.c,&local_38);
      cur_node_03._M_elems[1] = local_38._M_elems[1];
      cur_node_03._M_elems[0] = local_38._M_elems[0];
      bVar5 = IsVisited(this,cur_node_03);
      if (!bVar5) {
        *&(this->node_master_)._M_elems[local_38._M_elems[0]]._M_elems[local_38._M_elems[1]].
          parent_node_._M_elems = cur_node._M_elems;
      }
    }
    if (((this->temp_goal_ == false) && (iVar6 != 0 && -1 < (long)cur_node._M_elems)) &&
       ((curr_dir != 'E' && (bVar2 == false)))) {
      std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::push_back
                (&(this->node_master_)._M_elems[iVar8]._M_elems[lVar7].child_node_.c,&local_40);
      cur_node_02._M_elems[1] = local_40._M_elems[1];
      cur_node_02._M_elems[0] = local_40._M_elems[0];
      bVar5 = IsVisited(this,cur_node_02);
      if (!bVar5) {
        *&(this->node_master_)._M_elems[local_40._M_elems[0]]._M_elems[local_40._M_elems[1]].
          parent_node_._M_elems = cur_node._M_elems;
      }
    }
    if ((((this->temp_goal_ == false) && (iVar8 < 0xf)) && (curr_dir != 'N')) && (bVar1 == false)) {
      std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::push_back
                (&(this->node_master_)._M_elems[iVar8]._M_elems[lVar7].child_node_.c,&local_48);
      cur_node_01._M_elems[1] = local_48._M_elems[1];
      cur_node_01._M_elems[0] = local_48._M_elems[0];
      bVar5 = IsVisited(this,cur_node_01);
      if (!bVar5) {
        *&(this->node_master_)._M_elems[local_48._M_elems[0]]._M_elems[local_48._M_elems[1]].
          parent_node_._M_elems = cur_node._M_elems;
      }
    }
  }
  return;
}

Assistant:

void fp::Algorithm::FindNeighbours(std::array<int, 2> cur_node, char curr_dir) {
    char robotDirection{this->robot_->GetDirection()};
    bool N{this->maze_info.North_[cur_node[0]][cur_node[1]]},
            S{this->maze_info.South_[cur_node[0]][cur_node[1]]},
            E{this->maze_info.East_[cur_node[0]][cur_node[1]]},
            W{this->maze_info.West_[cur_node[0]][cur_node[1]]};

    //---> Compute the neighbouring possible  nodes <---//
    std::array<int, 2> node_N{cur_node[0] - 1, cur_node[1]},
            node_W{cur_node[0], cur_node[1] - 1},
            node_S{cur_node[0] + 1, cur_node[1]},
            node_E{cur_node[0], cur_node[1] + 1};

    if (!IsVisited(cur_node)) {
        this->visited_node_[cur_node[0]][cur_node[1]] = true;
        this->visited_Count++;
        if (!this->temp_goal_ && node_E[1] <= 15 && !E && curr_dir != 'W') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_E);
            if (!IsVisited(node_E))
                this->node_master_[node_E[0]][node_E[1]].parent_node_ = cur_node;
        }
        if (!this->temp_goal_ && node_N[0] >= 0 && !N && curr_dir != 'S') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_N);
            if (!IsVisited(node_N))
                this->node_master_[node_N[0]][node_N[1]].parent_node_ = cur_node;
        }
        if (!this->temp_goal_ && node_W[1] >= 0 && !W && curr_dir != 'E') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_W);
            if (!IsVisited(node_W))
                this->node_master_[node_W[0]][node_W[1]].parent_node_ = cur_node;
        }
        if (!this->temp_goal_ && node_S[0] <= 15 && !S && curr_dir != 'N') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_S);
            if (!IsVisited(node_S))
                this->node_master_[node_S[0]][node_S[1]].parent_node_ = cur_node;
        }
    }
}